

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall FSlide::SlideMove(FSlide *this,AActor *mo,DVector2 *tryp,int numsteps)

{
  bool bVar1;
  TVector2<double> *other;
  double dVar2;
  DVector3 local_248;
  TVector3<double> local_230;
  TVector2<double> local_218;
  TVector2<double> local_208;
  undefined1 local_1f8 [40];
  TVector3<double> local_1d0;
  TVector2<double> local_1b8;
  undefined1 local_1a8 [8];
  DVector2 startvel;
  DVector3 local_188;
  TVector3<double> local_170;
  TVector2<double> local_158;
  TVector2<double> local_148;
  DVector3 local_138;
  TVector3<double> local_120;
  TVector2<double> local_108;
  TVector2<double> local_f8;
  TVector2<double> local_e8;
  TVector2<double> local_d8;
  TVector2<double> local_c8;
  TVector2<double> local_b8;
  TVector2<double> local_a8;
  TVector2<double> local_98;
  TVector2<double> local_88;
  int local_74;
  secplane_t *psStack_70;
  int hitcount;
  secplane_t *walkplane;
  DVector2 move;
  DVector2 newpos;
  DVector2 trail;
  DVector2 lead;
  int numsteps_local;
  DVector2 *tryp_local;
  AActor *mo_local;
  FSlide *this_local;
  
  TVector2<double>::TVector2((TVector2<double> *)&trail.Y);
  TVector2<double>::TVector2((TVector2<double> *)&newpos.Y);
  TVector2<double>::TVector2((TVector2<double> *)&move.Y);
  TVector2<double>::TVector2((TVector2<double> *)&walkplane);
  local_74 = 3;
  this->slidemo = mo;
  if (((mo->player == (player_t *)0x0) || (mo->player->mo != (APlayerPawn *)mo)) ||
     (mo->reactiontime < 1)) {
    do {
      local_74 = local_74 + -1;
      if (local_74 == 0) {
LAB_006757b6:
        TVector2<double>::TVector2(&local_f8,0.0,tryp->Y);
        TVector2<double>::operator=((TVector2<double> *)&walkplane,&local_f8);
        psStack_70 = P_CheckSlopeWalk(mo,(DVector2 *)&walkplane);
        AActor::Pos(&local_138,mo);
        operator+(&local_120,&local_138,(Vector2 *)&walkplane);
        TVector2<double>::TVector2(&local_108,&local_120);
        bVar1 = P_TryMove(mo,&local_108,1,psStack_70);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          return;
        }
        TVector2<double>::TVector2(&local_148,tryp->X,0.0);
        TVector2<double>::operator=((TVector2<double> *)&walkplane,&local_148);
        psStack_70 = P_CheckSlopeWalk(mo,(DVector2 *)&walkplane);
        AActor::Pos(&local_188,mo);
        operator+(&local_170,&local_188,(Vector2 *)&walkplane);
        TVector2<double>::TVector2(&local_158,&local_170);
        P_TryMove(mo,&local_158,1,psStack_70);
        return;
      }
      if (tryp->X <= 0.0) {
        dVar2 = AActor::X(mo);
        trail.Y = dVar2 - mo->radius;
        dVar2 = AActor::X(mo);
        newpos.Y = dVar2 + mo->radius;
      }
      else {
        dVar2 = AActor::X(mo);
        trail.Y = dVar2 + mo->radius;
        dVar2 = AActor::X(mo);
        newpos.Y = dVar2 - mo->radius;
      }
      if (tryp->Y <= 0.0) {
        dVar2 = AActor::Y(mo);
        lead.X = dVar2 - mo->radius;
        dVar2 = AActor::Y(mo);
        trail.X = dVar2 + mo->radius;
      }
      else {
        dVar2 = AActor::Y(mo);
        lead.X = dVar2 + mo->radius;
        dVar2 = AActor::Y(mo);
        trail.X = dVar2 - mo->radius;
      }
      this->bestSlidefrac = 1.01;
      TVector2<double>::operator+(&local_88,(TVector2<double> *)&trail.Y);
      SlideTraverse(this,(DVector2 *)&trail.Y,&local_88);
      TVector2<double>::TVector2(&local_98,newpos.Y,lead.X);
      TVector2<double>::TVector2(&local_b8,newpos.Y,lead.X);
      TVector2<double>::operator+(&local_a8,tryp);
      SlideTraverse(this,&local_98,&local_a8);
      TVector2<double>::TVector2(&local_c8,trail.Y,trail.X);
      TVector2<double>::TVector2(&local_e8,trail.Y,trail.X);
      TVector2<double>::operator+(&local_d8,tryp);
      SlideTraverse(this,&local_c8,&local_d8);
      if (1.0 < this->bestSlidefrac) goto LAB_006757b6;
      this->bestSlidefrac = this->bestSlidefrac - 0.03125;
      if (0.0 < this->bestSlidefrac) {
        ::operator*((TVector2<double> *)&startvel.Y,this->bestSlidefrac);
        TVector2<double>::operator=((TVector2<double> *)&move.Y,(TVector2<double> *)&startvel.Y);
        TVector3<double>::XY((TVector3<double> *)local_1a8);
        AActor::Pos((DVector3 *)(local_1f8 + 0x10),mo);
        operator+(&local_1d0,(TVector3<double> *)(local_1f8 + 0x10),(Vector2 *)&move.Y);
        TVector2<double>::TVector2(&local_1b8,&local_1d0);
        bVar1 = P_TryMove(mo,&local_1b8,1,(secplane_t *)0x0);
        if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_006757b6;
        TVector3<double>::XY((TVector3<double> *)local_1f8);
        bVar1 = TVector2<double>::operator!=
                          ((TVector2<double> *)local_1f8,(TVector2<double> *)local_1a8);
        if (bVar1) {
          return;
        }
      }
      this->bestSlidefrac = 1.0 - (this->bestSlidefrac + 0.03125);
      if (this->bestSlidefrac <= 1.0) {
        if (this->bestSlidefrac <= 0.0) {
          return;
        }
      }
      else {
        this->bestSlidefrac = 1.0;
      }
      ::operator*(&local_208,this->bestSlidefrac);
      other = TVector2<double>::operator=(&this->tmmove,&local_208);
      TVector2<double>::operator=(tryp,other);
      HitSlideLine(this,this->bestslideline);
      (mo->Vel).X = (this->tmmove).X * (double)numsteps;
      (mo->Vel).Y = (this->tmmove).Y * (double)numsteps;
      if ((mo->player != (player_t *)0x0) && (mo->player->mo == (APlayerPawn *)mo)) {
        if (ABS((mo->Vel).X) < ABS((mo->player->Vel).X)) {
          (mo->player->Vel).X = (mo->Vel).X;
        }
        if (ABS((mo->Vel).Y) < ABS((mo->player->Vel).Y)) {
          (mo->player->Vel).Y = (mo->Vel).Y;
        }
      }
      psStack_70 = P_CheckSlopeWalk(mo,&this->tmmove);
      AActor::Pos(&local_248,mo);
      operator+(&local_230,&local_248,&this->tmmove);
      TVector2<double>::TVector2(&local_218,&local_230);
      bVar1 = P_TryMove(mo,&local_218,1,psStack_70);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  return;
}

Assistant:

void FSlide::SlideMove(AActor *mo, DVector2 tryp, int numsteps)
{
	DVector2 lead;
	DVector2 trail;
	DVector2 newpos;
	DVector2 move;
	const secplane_t * walkplane;
	int hitcount;

	hitcount = 3;
	slidemo = mo;

	if (mo->player && mo->player->mo == mo && mo->reactiontime > 0)
		return;	// player coming right out of a teleporter.

retry:
	if (!--hitcount)
		goto stairstep; 		// don't loop forever

	// trace along the three leading corners
	if (tryp.X > 0)
	{
		lead.X = mo->X() + mo->radius;
		trail.X = mo->X() - mo->radius;
	}
	else
	{
		lead.X = mo->X() - mo->radius;
		trail.X = mo->X() + mo->radius;
	}

	if (tryp.Y > 0)
	{
		lead.Y = mo->Y() + mo->radius;
		trail.Y = mo->Y() - mo->radius;
	}
	else
	{
		lead.Y = mo->Y() - mo->radius;
		trail.Y = mo->Y() + mo->radius;
	}

	bestSlidefrac = 1.01;

	SlideTraverse(lead, lead + tryp);
	SlideTraverse(DVector2(trail.X, lead.Y), tryp + DVector2(trail.X, lead.Y));
	SlideTraverse(DVector2(lead.X, trail.Y), tryp + DVector2(lead.X, trail.Y));

	// move up to the wall
	if (bestSlidefrac > 1)
	{
		// the move must have hit the middle, so stairstep
	stairstep:
		// killough 3/15/98: Allow objects to drop off ledges
		move = { 0, tryp.Y };
		walkplane = P_CheckSlopeWalk(mo, move);
		if (!P_TryMove(mo, mo->Pos() + move, true, walkplane))
		{
			move = { tryp.X, 0 };
			walkplane = P_CheckSlopeWalk(mo, move);
			P_TryMove(mo, mo->Pos() + move, true, walkplane);
		}
		return;
	}

	// fudge a bit to make sure it doesn't hit
	bestSlidefrac -= 1. / 32;
	if (bestSlidefrac > 0)
	{
		newpos = tryp * bestSlidefrac;

		// [BL] We need to abandon this function if we end up going through a teleporter
		const DVector2 startvel = mo->Vel.XY();

		// killough 3/15/98: Allow objects to drop off ledges
		if (!P_TryMove(mo, mo->Pos() + newpos, true))
			goto stairstep;

		if (mo->Vel.XY() != startvel)
			return;
	}

	// Now continue along the wall.
	bestSlidefrac = 1. - (bestSlidefrac + 1. / 32);	// remainder
	if (bestSlidefrac > 1)
		bestSlidefrac = 1;
	else if (bestSlidefrac <= 0)
		return;

	tryp = tmmove = tryp*bestSlidefrac;

	HitSlideLine(bestslideline); 	// clip the moves

	mo->Vel.X = tmmove.X * numsteps;
	mo->Vel.Y = tmmove.Y * numsteps;

	// killough 10/98: affect the bobbing the same way (but not voodoo dolls)
	if (mo->player && mo->player->mo == mo)
	{
		if (fabs(mo->player->Vel.X) > fabs(mo->Vel.X))
			mo->player->Vel.X = mo->Vel.X;
		if (fabs(mo->player->Vel.Y) > fabs(mo->Vel.Y))
			mo->player->Vel.Y = mo->Vel.Y;
	}

	walkplane = P_CheckSlopeWalk(mo, tmmove);

	// killough 3/15/98: Allow objects to drop off ledges
	if (!P_TryMove(mo, mo->Pos() + tmmove, true, walkplane))
	{
		goto retry;
	}
}